

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O3

void __thiscall
Js::InterpreterStackFrame::OP_LdLocalElementUndefined<Js::LayoutSizePolicy<(Js::LayoutSize)2>>
          (InterpreterStackFrame *this,
          OpLayoutT_ElementRootU<Js::LayoutSizePolicy<(Js::LayoutSize)2>_> *playout)

{
  byte bVar1;
  Var instance;
  PropertyId propertyId;
  
  instance = *(Var *)(this + 0x58);
  bVar1 = ((*(FunctionBody **)(this + 0x88))->super_ParseableFunctionInfo).super_FunctionProxy.
          field_0x47;
  propertyId = FunctionBody::GetReferencedPropertyId
                         (*(FunctionBody **)(this + 0x88),playout->PropertyIdIndex);
  if ((bVar1 & 1) != 0) {
    JavascriptOperators::OP_LoadUndefinedToElementDynamic
              (instance,propertyId,*(ScriptContext **)(this + 0x78));
    return;
  }
  JavascriptOperators::OP_LoadUndefinedToElement(instance,propertyId);
  return;
}

Assistant:

void InterpreterStackFrame::OP_LdLocalElementUndefined(const unaligned OpLayoutT_ElementRootU<T>* playout)
    {
        if (this->m_functionBody->IsEval())
        {
            JavascriptOperators::OP_LoadUndefinedToElementDynamic(this->localClosure,
                this->m_functionBody->GetReferencedPropertyId(playout->PropertyIdIndex), GetScriptContext());
        }
        else
        {
            JavascriptOperators::OP_LoadUndefinedToElement(this->localClosure,
                this->m_functionBody->GetReferencedPropertyId(playout->PropertyIdIndex));
        }
    }